

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws-ring.c
# Opt level: O0

size_t lws_ring_get_count_waiting_elements(lws_ring *ring,uint32_t *tail)

{
  uint local_1c;
  uint32_t *puStack_18;
  int f;
  uint32_t *tail_local;
  lws_ring *ring_local;
  
  puStack_18 = tail;
  if (tail == (uint32_t *)0x0) {
    puStack_18 = &ring->oldest_tail;
  }
  if (ring->head == *puStack_18) {
    local_1c = 0;
  }
  else if (*puStack_18 < ring->head) {
    local_1c = ring->head - *puStack_18;
  }
  else {
    local_1c = (ring->buflen - *puStack_18) + ring->head;
  }
  return (ulong)local_1c / (ulong)ring->element_len;
}

Assistant:

size_t
lws_ring_get_count_waiting_elements(struct lws_ring *ring, uint32_t *tail)
{	int f;

	if (!tail)
		tail = &ring->oldest_tail;
	/*
	 * possible ringbuf patterns
	 *
	 * h == t
	 * |--------t***h---|
	 * |**h-----------t*|
	 * |t**************h|
	 * |*****ht*********|
	 */
	if (ring->head == *tail)
		f = 0;
	else
		if (ring->head > *tail)
			f = (int)(ring->head - *tail);
		else
			f = (int)((ring->buflen - *tail) + ring->head);

	return (unsigned int)f / ring->element_len;
}